

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp
# Opt level: O3

bool __thiscall
gl4cts::DirectStateAccess::Renderbuffers::StorageTest::Check
          (StorageTest *this,RenderbufferInternalFormatConfiguration format,GLuint width,
          GLuint height)

{
  char *pcVar1;
  int iVar2;
  deUint32 dVar3;
  undefined4 extraout_var;
  size_t sVar5;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  float fVar10;
  float fVar11;
  char local_1dc [4];
  GLuint local_1d8;
  GLuint local_1d4;
  vector<float,_std::allocator<float>_> local_1d0;
  float local_1b4;
  undefined1 local_1b0 [8];
  _func_int **local_1a8;
  ios_base local_138 [264];
  long lVar4;
  
  iVar2 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar4 = CONCAT44(extraout_var,iVar2);
  uVar7 = height * width;
  local_1d8 = height;
  local_1d4 = width;
  if ((((format.hasRedComponent != false) || (format.hasGreenComponent != false)) ||
      (format.hasBlueComponent != false)) || (format.hasAlphaComponent == true)) {
    if (format.isColorIntegralFormat == true) {
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)&local_1d0,(ulong)(uVar7 * 4),
                 (allocator_type *)local_1b0);
      (**(code **)(lVar4 + 0x1220))
                (0,0,local_1d4,local_1d8,0x8d99,0x1404,
                 local_1d0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start);
      dVar3 = (**(code **)(lVar4 + 0x800))();
      glu::checkError(dVar3,"glReadPixels call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                      ,0x200c);
      local_1dc[0] = format.hasRedComponent;
      local_1dc[1] = format.hasGreenComponent;
      local_1dc[2] = format.hasBlueComponent;
      local_1dc[3] = format.hasAlphaComponent;
      if (uVar7 != 0) {
        uVar8 = 0;
        do {
          uVar9 = (ulong)((uint)uVar8 & 3);
          if (local_1dc[uVar9] == '\x01') {
            iVar6 = *(int *)(s_reference_color_integer + uVar9 * 4) -
                    (int)local_1d0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_start[uVar8];
            iVar2 = -iVar6;
            if (0 < iVar6) {
              iVar2 = iVar6;
            }
            if (2 < iVar2) {
              local_1b0 = (undefined1  [8])((this->super_TestCase).m_context)->m_testCtx->m_log;
              std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_1a8,"Renderbuffer storage was cleared with color ",0x2c);
              pcVar1 = Check::componentName[uVar9];
              sVar5 = strlen(pcVar1);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,pcVar1,sVar5)
              ;
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_1a8," component equal to ",0x14);
              std::ostream::_M_insert<void_const*>((ostringstream *)&local_1a8);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_1a8,", but fetched value ",0x14);
              std::ostream::operator<<
                        ((ostringstream *)&local_1a8,
                         (int)local_1d0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_start[uVar8]);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_1a8," is not the same. Renderbuffers format was ",0x2b);
              if (format.internalformat_name == (GLchar *)0x0) {
                std::ios::clear((int)(ostringstream *)&local_1a8 + (int)local_1a8[-3]);
              }
              else {
                sVar5 = strlen(format.internalformat_name);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&local_1a8,format.internalformat_name,sVar5);
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_1a8,", width was ",0xc);
              std::ostream::_M_insert<unsigned_long>((ulong)&local_1a8);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_1a8,", height was ",0xd);
              std::ostream::_M_insert<unsigned_long>((ulong)&local_1a8);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,".",1);
              tcu::MessageBuilder::operator<<
                        ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
              goto LAB_00a9c5e3;
            }
          }
          uVar8 = uVar8 + 1;
        } while (uVar7 != uVar8);
      }
    }
    else {
      std::vector<float,_std::allocator<float>_>::vector
                (&local_1d0,(ulong)(uVar7 * 4),(allocator_type *)local_1b0);
      (**(code **)(lVar4 + 0x1220))
                (0,0,local_1d4,local_1d8,0x1908,0x1406,
                 local_1d0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start);
      dVar3 = (**(code **)(lVar4 + 0x800))();
      glu::checkError(dVar3,"glReadPixels call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                      ,0x202b);
      local_1dc[0] = format.hasRedComponent;
      local_1dc[1] = format.hasGreenComponent;
      local_1dc[2] = format.hasBlueComponent;
      local_1dc[3] = format.hasAlphaComponent;
      if (uVar7 != 0) {
        uVar8 = 0;
        do {
          uVar9 = (ulong)((uint)uVar8 & 3);
          if (local_1dc[uVar9] == '\x01') {
            fVar11 = *(float *)(s_reference_color + uVar9 * 4) -
                     local_1d0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar8];
            fVar10 = -fVar11;
            if (-fVar11 <= fVar11) {
              fVar10 = fVar11;
            }
            if (0.0625 < fVar10) {
              local_1b0 = (undefined1  [8])((this->super_TestCase).m_context)->m_testCtx->m_log;
              local_1b4 = *(float *)(s_reference_color + uVar9 * 4);
              std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_1a8,"Renderbuffer storage was cleared with color ",0x2c);
              pcVar1 = Check::componentName[uVar9];
              sVar5 = strlen(pcVar1);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,pcVar1,sVar5)
              ;
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_1a8," component equal to ",0x14);
              std::ostream::_M_insert<double>((double)local_1b4);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_1a8,", but fetched value ",0x14);
              std::ostream::_M_insert<double>
                        ((double)local_1d0.super__Vector_base<float,_std::allocator<float>_>._M_impl
                                 .super__Vector_impl_data._M_start[uVar8]);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_1a8," is not the same. Renderbuffers format was ",0x2b);
              if (format.internalformat_name == (GLchar *)0x0) {
                std::ios::clear((int)(ostringstream *)&local_1a8 + (int)local_1a8[-3]);
              }
              else {
                sVar5 = strlen(format.internalformat_name);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&local_1a8,format.internalformat_name,sVar5);
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_1a8,", width was ",0xc);
              std::ostream::_M_insert<unsigned_long>((ulong)&local_1a8);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_1a8,", height was ",0xd);
              std::ostream::_M_insert<unsigned_long>((ulong)&local_1a8);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,".",1);
              tcu::MessageBuilder::operator<<
                        ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
              goto LAB_00a9c5e3;
            }
          }
          uVar8 = uVar8 + 1;
        } while (uVar7 != uVar8);
      }
    }
    local_1dc[3] = format.hasAlphaComponent;
    local_1dc[2] = format.hasBlueComponent;
    local_1dc[1] = format.hasGreenComponent;
    local_1dc[0] = format.hasRedComponent;
    if (local_1d0.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_1d0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_1d0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_1d0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  if (format.hasDepthComponent == true) {
    std::vector<float,_std::allocator<float>_>::vector
              (&local_1d0,(ulong)uVar7,(allocator_type *)local_1b0);
    (**(code **)(lVar4 + 0x1220))
              (0,0,local_1d4,local_1d8,0x1902,0x1406,
               local_1d0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start);
    dVar3 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar3,"glReadPixels call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                    ,0x204c);
    if (uVar7 == 0) {
      if (local_1d0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start == (pointer)0x0) goto LAB_00a9c034;
    }
    else {
      uVar8 = 0;
      do {
        fVar11 = 0.5 - local_1d0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar8];
        fVar10 = -fVar11;
        if (-fVar11 <= fVar11) {
          fVar10 = fVar11;
        }
        if (0.0625 < fVar10) {
          local_1b0 = (undefined1  [8])((this->super_TestCase).m_context)->m_testCtx->m_log;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1a8,
                     "Renderbuffer storage was cleared with depth component equal to ",0x3f);
          std::ostream::_M_insert<double>(0.5);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1a8,", but fetched value ",0x14);
          std::ostream::_M_insert<double>
                    ((double)local_1d0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                             super__Vector_impl_data._M_start[uVar8]);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1a8," is not the same. Renderbuffers format was ",0x2b);
          if (format.internalformat_name == (GLchar *)0x0) {
            std::ios::clear((int)(ostringstream *)&local_1a8 + (int)local_1a8[-3]);
          }
          else {
            sVar5 = strlen(format.internalformat_name);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_1a8,format.internalformat_name,sVar5);
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1a8,", width was ",0xc);
          std::ostream::_M_insert<unsigned_long>((ulong)&local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1a8,", height was ",0xd);
          std::ostream::_M_insert<unsigned_long>((ulong)&local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,".",1);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
          goto LAB_00a9c5e3;
        }
        uVar8 = uVar8 + 1;
      } while (uVar7 != uVar8);
    }
    operator_delete(local_1d0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1d0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1d0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
LAB_00a9c034:
  if (format.hasStencilComponent == true) {
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)&local_1d0,(ulong)uVar7,
               (allocator_type *)local_1b0);
    (**(code **)(lVar4 + 0x1220))
              (0,0,local_1d4,local_1d8,0x1901,0x1404,
               local_1d0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start);
    dVar3 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar3,"glReadPixels call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                    ,0x2062);
    if (uVar7 == 0) {
      if (local_1d0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start == (pointer)0x0) {
        return true;
      }
    }
    else {
      uVar8 = 0;
      do {
        if (local_1d0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start[uVar8] != 9.80909e-45) {
          local_1b0 = (undefined1  [8])((this->super_TestCase).m_context)->m_testCtx->m_log;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1a8,
                     "Renderbuffer storage was cleared with alpha component equal to ",0x3f);
          std::ostream::operator<<((ostringstream *)&local_1a8,7);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1a8,", but fetched value ",0x14);
          std::ostream::operator<<
                    ((ostringstream *)&local_1a8,
                     (int)local_1d0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start[uVar8]);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1a8," is not the same. Renderbuffers format was ",0x2b);
          if (format.internalformat_name == (GLchar *)0x0) {
            std::ios::clear((int)(ostringstream *)&local_1a8 + (int)local_1a8[-3]);
          }
          else {
            sVar5 = strlen(format.internalformat_name);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_1a8,format.internalformat_name,sVar5);
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1a8,", width was ",0xc);
          std::ostream::_M_insert<unsigned_long>((ulong)&local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1a8,", height was ",0xd);
          std::ostream::_M_insert<unsigned_long>((ulong)&local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,".",1);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
LAB_00a9c5e3:
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
          std::ios_base::~ios_base(local_138);
          if (local_1d0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_1d0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_1d0.super__Vector_base<float,_std::allocator<float>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_1d0.super__Vector_base<float,_std::allocator<float>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          return false;
        }
        uVar8 = uVar8 + 1;
      } while (uVar7 != uVar8);
    }
    operator_delete(local_1d0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1d0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1d0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return true;
}

Assistant:

bool StorageTest::Check(StorageTest::RenderbufferInternalFormatConfiguration format, glw::GLuint width,
						glw::GLuint height)
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	glw::GLuint size = width * height;

	if (format.hasRedComponent || format.hasGreenComponent || format.hasBlueComponent || format.hasAlphaComponent)
	{
		if (format.isColorIntegralFormat)
		{
			std::vector<glw::GLint> color(size * 4);

			gl.readPixels(0, 0, width, height, GL_RGBA_INTEGER, GL_INT, &color[0]);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glReadPixels call failed.");

			const bool hasComponent[] = { format.hasRedComponent, format.hasGreenComponent, format.hasBlueComponent,
										  format.hasAlphaComponent };

			static const char* componentName[] = { "red", "green", "blue", "alpha" };

			for (glw::GLuint i = 0; i < size; ++i)
			{
				if (hasComponent[i % 4 /* color components count*/])
				{
					if (de::abs(s_reference_color_integer[i % 4 /* color components count*/] - color[i]) >
						2 /* Precision */)
					{
						m_context.getTestContext().getLog()
							<< tcu::TestLog::Message << "Renderbuffer storage was cleared with color "
							<< componentName[i % 4 /* color components count*/] << " component equal to "
							<< s_reference_color_integer << ", but fetched value " << color[i]
							<< " is not the same. Renderbuffers format was " << format.internalformat_name
							<< ", width was " << width << ", height was " << height << "." << tcu::TestLog::EndMessage;

						return false;
					}
				}
			}
		}
		else
		{
			std::vector<glw::GLfloat> color(size * 4);

			gl.readPixels(0, 0, width, height, GL_RGBA, GL_FLOAT, &color[0]);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glReadPixels call failed.");

			const bool hasComponent[] = { format.hasRedComponent, format.hasGreenComponent, format.hasBlueComponent,
										  format.hasAlphaComponent };

			static const char* componentName[] = { "red", "green", "blue", "alpha" };

			for (glw::GLuint i = 0; i < size; ++i)
			{
				if (hasComponent[i % 4 /* color components count*/])
				{
					if (de::abs(s_reference_color[i % 4 /* color components count*/] - color[i]) >
						0.0625 /* precision */)
					{
						m_context.getTestContext().getLog()
							<< tcu::TestLog::Message << "Renderbuffer storage was cleared with color "
							<< componentName[i % 4 /* color components count*/] << " component equal to "
							<< s_reference_color[i % 4 /* color components count*/] << ", but fetched value "
							<< color[i] << " is not the same. Renderbuffers format was " << format.internalformat_name
							<< ", width was " << width << ", height was " << height << "." << tcu::TestLog::EndMessage;

						return false;
					}
				}
			}
		}
	}

	if (format.hasDepthComponent)
	{
		std::vector<glw::GLfloat> depth(size);

		gl.readPixels(0, 0, width, height, GL_DEPTH_COMPONENT, GL_FLOAT, &depth[0]);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glReadPixels call failed.");

		for (glw::GLuint i = 0; i < size; ++i)
		{
			if (de::abs(s_reference_depth - depth[i]) > 0.0625 /* 1/16 precision */)
			{
				m_context.getTestContext().getLog()
					<< tcu::TestLog::Message << "Renderbuffer storage was cleared with depth component equal to "
					<< s_reference_depth << ", but fetched value " << depth[i]
					<< " is not the same. Renderbuffers format was " << format.internalformat_name << ", width was "
					<< width << ", height was " << height << "." << tcu::TestLog::EndMessage;

				return false;
			}
		}
	}

	if (format.hasStencilComponent)
	{
		std::vector<glw::GLint> stencil(size);

		gl.readPixels(0, 0, width, height, GL_STENCIL_INDEX, GL_INT, &stencil[0]);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glReadPixels call failed.");

		for (glw::GLuint i = 0; i < size; ++i)
		{
			if (s_reference_stencil != stencil[i])
			{
				m_context.getTestContext().getLog()
					<< tcu::TestLog::Message << "Renderbuffer storage was cleared with alpha component equal to "
					<< s_reference_stencil << ", but fetched value " << stencil[i]
					<< " is not the same. Renderbuffers format was " << format.internalformat_name << ", width was "
					<< width << ", height was " << height << "." << tcu::TestLog::EndMessage;

				return false;
			}
		}
	}

	return true;
}